

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Demangle.cpp
# Opt level: O2

bool WTF::ParseName(State *state)

{
  undefined2 uVar1;
  undefined1 uVar3;
  undefined1 uVar4;
  int iVar2;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  undefined8 uVar9;
  int iVar10;
  short sVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  short sVar17;
  char *pcVar18;
  State copy;
  undefined4 local_3c;
  undefined4 uStack_38;
  
  pcVar5 = state->mangled_cur;
  pcVar6 = state->out_cur;
  pcVar7 = state->out_begin;
  pcVar8 = state->out_end;
  uVar9 = *(undefined8 *)((long)&state->prev_name + 4);
  uStack_38 = (undefined4)((ulong)*(undefined8 *)((long)&state->out_end + 4) >> 0x20);
  local_3c = (undefined4)((ulong)pcVar8 >> 0x20);
  uVar1 = state->nest_level;
  uVar3 = state->append;
  uVar4 = state->overflowed;
  if (*state->mangled_cur == 'N') {
    state->mangled_cur = state->mangled_cur + 1;
    state->nest_level = 0;
    ParseCVQualifiers(state);
    do {
      sVar17 = state->nest_level;
      bVar14 = false;
      while( true ) {
        if (0 < sVar17) {
          MaybeAppend(state,"::");
        }
        bVar13 = ParseTemplateParam(state);
        if (((!bVar13) && (bVar13 = ParseSubstitution(state), !bVar13)) &&
           (bVar13 = ParseUnscopedName(state), !bVar13)) break;
        sVar17 = state->nest_level;
        bVar14 = true;
        if (-1 < sVar17) {
          sVar17 = sVar17 + 1;
          state->nest_level = sVar17;
        }
      }
      if (((0 < state->nest_level) && (state->append == true)) &&
         (pcVar18 = state->out_cur + -2, state->out_begin <= pcVar18)) {
        state->out_cur = pcVar18;
        *pcVar18 = '\0';
      }
    } while ((bVar14) && (bVar14 = ParseTemplateArgs(state), bVar14));
    state->nest_level = uVar1;
    if (*state->mangled_cur == 'E') {
      state->mangled_cur = state->mangled_cur + 1;
      return true;
    }
  }
  *(ulong *)((long)&state->out_end + 4) = CONCAT44(uStack_38,local_3c);
  *(undefined8 *)((long)&state->prev_name + 4) = uVar9;
  state->out_begin = pcVar7;
  state->out_end = pcVar8;
  state->mangled_cur = pcVar5;
  state->out_cur = pcVar6;
  state->nest_level = uVar1;
  state->append = (bool)uVar3;
  state->overflowed = (bool)uVar4;
  pcVar6 = state->mangled_cur;
  pcVar7 = state->out_cur;
  pcVar8 = state->out_begin;
  pcVar18 = state->out_end;
  pcVar5 = state->prev_name;
  iVar2 = state->prev_name_length;
  sVar17 = state->nest_level;
  bVar14 = state->append;
  bVar13 = state->overflowed;
  iVar10 = state->prev_name_length;
  sVar11 = state->nest_level;
  bVar16 = state->append;
  bVar12 = state->overflowed;
  if (*state->mangled_cur == 'Z') {
    state->mangled_cur = state->mangled_cur + 1;
    bVar15 = ParseEncoding(state);
    if ((bVar15) && (*state->mangled_cur == 'E')) {
      state->mangled_cur = state->mangled_cur + 1;
      MaybeAppend(state,"::");
      bVar15 = ParseName(state);
      if (bVar15) goto LAB_00108418;
    }
  }
  state->mangled_cur = pcVar6;
  state->out_cur = pcVar7;
  state->prev_name = pcVar5;
  state->prev_name_length = iVar2;
  state->nest_level = sVar17;
  state->append = bVar14;
  state->overflowed = bVar13;
  state->out_begin = pcVar8;
  state->out_end = pcVar18;
  if (*state->mangled_cur == 'Z') {
    state->mangled_cur = state->mangled_cur + 1;
    bVar14 = ParseEncoding(state);
    if ((bVar14) && (bVar14 = ParseTwoCharToken(state,"Es"), bVar14)) {
LAB_00108418:
      ParseDiscriminator(state);
      return true;
    }
  }
  state->prev_name = pcVar5;
  state->prev_name_length = iVar10;
  state->nest_level = sVar11;
  state->append = bVar16;
  state->overflowed = bVar12;
  state->out_begin = pcVar8;
  state->out_end = pcVar18;
  state->mangled_cur = pcVar6;
  state->out_cur = pcVar7;
  pcVar6 = state->mangled_cur;
  pcVar7 = state->out_cur;
  pcVar8 = state->out_begin;
  pcVar18 = state->out_end;
  pcVar5 = state->prev_name;
  iVar2 = state->prev_name_length;
  sVar17 = state->nest_level;
  bVar14 = state->append;
  bVar13 = state->overflowed;
  bVar16 = ParseUnscopedName(state);
  if (((bVar16) || (bVar16 = ParseSubstitution(state), bVar16)) &&
     (bVar16 = ParseTemplateArgs(state), bVar16)) {
    return true;
  }
  state->prev_name = pcVar5;
  state->prev_name_length = iVar2;
  state->nest_level = sVar17;
  state->append = bVar14;
  state->overflowed = bVar13;
  state->out_begin = pcVar8;
  state->out_end = pcVar18;
  state->mangled_cur = pcVar6;
  state->out_cur = pcVar7;
  bVar14 = ParseUnscopedName(state);
  return bVar14;
}

Assistant:

static bool ParseName(State *state) {
  if (ParseNestedName(state) || ParseLocalName(state)) {
    return true;
  }

  State copy = *state;
  if (ParseUnscopedTemplateName(state) &&
      ParseTemplateArgs(state)) {
    return true;
  }
  *state = copy;

  // Less greedy than <unscoped-template-name> <template-args>.
  if (ParseUnscopedName(state)) {
    return true;
  }
  return false;
}